

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O0

type_conflict2
jsoncons::detail::from_integer<int,jsoncons::stream_sink<char>>(int value,stream_sink<char> *result)

{
  int iVar1;
  int iVar2;
  string *s;
  stream_sink<char> *this;
  char *pcVar3;
  undefined8 in_RSI;
  int in_EDI;
  size_t count;
  bool is_negative;
  char_type *last;
  char_type *p;
  char_type buf [255];
  assertion_error *this_00;
  bool local_172;
  char in_stack_fffffffffffffe8f;
  allocator<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char *local_120;
  char local_118 [255];
  char acStack_19 [21];
  int local_4;
  
  local_120 = local_118;
  iVar2 = in_EDI;
  if (in_EDI < 0) {
    do {
      local_4 = iVar2;
      pcVar3 = local_120 + 1;
      *local_120 = '0' - (char)(local_4 % 10);
      iVar2 = local_4 / 10;
      in_stack_fffffffffffffe8f = iVar2 != 0 && pcVar3 < acStack_19;
      local_120 = pcVar3;
      iVar1 = local_4;
    } while ((bool)in_stack_fffffffffffffe8f);
  }
  else {
    do {
      local_4 = iVar2;
      pcVar3 = local_120 + 1;
      *local_120 = (char)(local_4 % 10) + '0';
      iVar2 = local_4 / 10;
      local_172 = iVar2 != 0 && pcVar3 < acStack_19;
      local_120 = pcVar3;
      iVar1 = local_4;
    } while (local_172);
  }
  local_4 = iVar2;
  if (local_120 == acStack_19) {
    s = (string *)__cxa_allocate_exception(0x10,in_RSI,(long)iVar1 % 10 & 0xffffffff);
    this_00 = (assertion_error *)&stack0xfffffffffffffeaf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    assertion_error::assertion_error(this_00,s);
    __cxa_throw(s,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  this = (stream_sink<char> *)(local_120 + -(long)local_118);
  if (in_EDI < 0) {
    stream_sink<char>::push_back(this,in_stack_fffffffffffffe8f);
    this = (stream_sink<char> *)((long)&this->stream_ptr_ + 1);
  }
  while (local_120 = local_120 + -1, local_118 <= local_120) {
    stream_sink<char>::push_back(this,in_stack_fffffffffffffe8f);
  }
  return (type_conflict2)this;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }